

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_band.c
# Opt level: O2

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  lVar2 = N_VGetArrayPointer();
  lVar3 = N_VGetArrayPointer(Y);
  lVar4 = N_VGetLength_Serial(X);
  lVar6 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar6;
  }
  iVar5 = 0;
  for (; lVar4 != lVar6; lVar6 = lVar6 + 1) {
    iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + lVar6 * 8),*(undefined8 *)(lVar3 + lVar6 * 8),tol
                          );
    iVar5 = iVar5 + iVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  else {
    dVar7 = 0.0;
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      dVar8 = ABS(*(double *)(lVar2 + lVar6 * 8) - *(double *)(lVar3 + lVar6 * 8));
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = dVar8;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",dVar7,tol);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i, local_length;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata        = N_VGetArrayPointer(X);
  Ydata        = N_VGetArrayPointer(Y);
  local_length = N_VGetLength_Serial(X);

  /* check vector data */
  for (i = 0; i < local_length; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < local_length; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}